

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

void __thiscall Highs::reportModel(Highs *this,HighsModel *model)

{
  int dim;
  HighsInt *start;
  HighsLogOptions *log_options;
  
  log_options = &(this->options_).super_HighsOptionsStruct.log_options;
  reportLp(log_options,&model->lp_,kVerbose);
  dim = (model->hessian_).dim_;
  if ((long)dim != 0) {
    start = (model->hessian_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
    reportHessian(log_options,dim,start[dim],start,
                  (model->hessian_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (model->hessian_).value_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start);
    return;
  }
  return;
}

Assistant:

void Highs::reportModel(const HighsModel& model) {
  reportLp(options_.log_options, model.lp_, HighsLogType::kVerbose);
  if (model.hessian_.dim_) {
    const HighsInt dim = model.hessian_.dim_;
    reportHessian(options_.log_options, dim, model.hessian_.start_[dim],
                  model.hessian_.start_.data(), model.hessian_.index_.data(),
                  model.hessian_.value_.data());
  }
}